

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void walRestartHdr(Wal *pWal,u32 salt1)

{
  uint uVar1;
  u32 *puVar2;
  int iVar3;
  long lVar4;
  
  puVar2 = *pWal->apWiData;
  pWal->nCkpt = pWal->nCkpt + 1;
  lVar4 = 0;
  (pWal->hdr).mxFrame = 0;
  uVar1 = (pWal->hdr).aSalt[0];
  iVar3 = (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) + 1;
  *(char *)(pWal->hdr).aSalt = (char)((uint)iVar3 >> 0x18);
  *(char *)((long)(pWal->hdr).aSalt + 1) = (char)((uint)iVar3 >> 0x10);
  *(char *)((long)(pWal->hdr).aSalt + 2) = (char)((uint)iVar3 >> 8);
  *(char *)((long)(pWal->hdr).aSalt + 3) = (char)iVar3;
  (pWal->hdr).aSalt[1] = salt1;
  walIndexWriteHdr(pWal);
  puVar2[0x18] = 0;
  puVar2[0x20] = 0;
  puVar2[0x1a] = 0;
  do {
    puVar2[lVar4 + 0x1b] = 0xffffffff;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  return;
}

Assistant:

static void walRestartHdr(Wal *pWal, u32 salt1){
  volatile WalCkptInfo *pInfo = walCkptInfo(pWal);
  int i;                          /* Loop counter */
  u32 *aSalt = pWal->hdr.aSalt;   /* Big-endian salt values */
  pWal->nCkpt++;
  pWal->hdr.mxFrame = 0;
  sqlite3Put4byte((u8*)&aSalt[0], 1 + sqlite3Get4byte((u8*)&aSalt[0]));
  memcpy(&pWal->hdr.aSalt[1], &salt1, 4);
  walIndexWriteHdr(pWal);
  AtomicStore(&pInfo->nBackfill, 0);
  pInfo->nBackfillAttempted = 0;
  pInfo->aReadMark[1] = 0;
  for(i=2; i<WAL_NREADER; i++) pInfo->aReadMark[i] = READMARK_NOT_USED;
  assert( pInfo->aReadMark[0]==0 );
}